

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_start(nn_aws *self,nn_usock *listener)

{
  nn_usock *in_RSI;
  long in_RDI;
  nn_fsm_owner *in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_AWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
            ,0x57);
    fflush(_stderr);
    nn_err_abort();
  }
  *(nn_usock **)(in_RDI + 0x2c8) = in_RSI;
  *(undefined4 *)(in_RDI + 0x2d0) = 3;
  *(long *)(in_RDI + 0x2d8) = in_RDI;
  nn_usock_swap_owner(in_RSI,in_stack_ffffffffffffffe8);
  nn_fsm_start((nn_fsm *)0x1575f7);
  return;
}

Assistant:

void nn_aws_start (struct nn_aws *self, struct nn_usock *listener)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_AWS_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}